

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O1

QAbstractItemView * __thiscall
QColumnViewPrivate::createColumn(QColumnViewPrivate *this,QModelIndex *index,bool show)

{
  uint uVar1;
  int iVar2;
  QWidget *parent;
  QAbstractItemModel *pQVar3;
  void **ppvVar4;
  ulong uVar5;
  QWidgetData *pQVar6;
  Connection CVar7;
  char cVar8;
  Representation w;
  int iVar9;
  LayoutDirection LVar10;
  QAbstractItemView *pQVar11;
  undefined4 *puVar12;
  QSize QVar13;
  QSize QVar14;
  QWidget *pQVar15;
  pointer piVar16;
  long lVar17;
  ulong size;
  long in_FS_OFFSET;
  code *local_e0;
  ImplFn local_d8;
  code *local_d0;
  ImplFn local_c8;
  code *local_c0;
  ImplFn local_b8;
  code *local_b0;
  ImplFn local_a8;
  code *local_a0;
  ImplFn local_98;
  Connection clickedConnection;
  QAbstractItemView *view;
  TryEmplaceResult local_80;
  undefined1 local_68 [8];
  undefined8 local_60;
  QObject local_58 [8];
  QObject local_50 [8];
  QObject local_48 [8];
  Connection local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  parent = *(QWidget **)
            &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
             super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  view = (QAbstractItemView *)0x0;
  clickedConnection.d_ptr = &DAT_aaaaaaaaaaaaaaaa;
  QMetaObject::Connection::Connection(&clickedConnection);
  pQVar3 = (this->super_QAbstractItemViewPrivate).model;
  cVar8 = (**(code **)(*(long *)pQVar3 + 0x88))(pQVar3,index);
  if (cVar8 == '\0') {
    if (this->previewColumn == (QAbstractItemView *)0x0) {
      pQVar15 = (QWidget *)operator_new(0x28);
      QWidget::QWidget(pQVar15,parent,(WindowFlags)0x0);
      setPreviewWidget(this,pQVar15);
    }
    pQVar15 = (QWidget *)this->previewColumn;
    view = (QAbstractItemView *)pQVar15;
    QVar13 = QWidget::minimumSize(pQVar15);
    QVar14 = QWidget::minimumSize(this->previewWidget);
    w.m_i = QVar13.wd.m_i.m_i;
    if (QVar13.wd.m_i.m_i <= QVar14.wd.m_i.m_i) {
      w.m_i = QVar14.wd.m_i.m_i;
    }
    QWidget::setMinimumWidth(pQVar15,w.m_i);
  }
  else {
    pQVar11 = (QAbstractItemView *)(**(code **)(*(long *)parent + 0x300))(parent,index);
    local_68 = (undefined1  [8])QAbstractItemView::clicked;
    local_60._0_4_ = 0;
    local_60._4_4_ = 0;
    local_80.iterator.i.d =
         (Data<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
          *)clicked;
    local_80.iterator.i.bucket = 0;
    ppvVar4 = *(void ***)
               &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                super_QFramePrivate.super_QWidgetPrivate.field_0x8;
    view = pQVar11;
    puVar12 = (undefined4 *)operator_new(0x20);
    *puVar12 = 1;
    *(code **)(puVar12 + 2) =
         QtPrivate::
         QPrivateSlotObject<void_(QColumnViewPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
         ::impl;
    *(code **)(puVar12 + 4) = clicked;
    *(undefined8 *)(puVar12 + 6) = 0;
    QObject::connectImpl
              ((QObject *)&local_a0,(void **)pQVar11,(QObject *)local_68,ppvVar4,
               (QSlotObjectBase *)&local_80,(ConnectionType)puVar12,(int *)0x0,(QMetaObject *)0x0);
    CVar7 = clickedConnection;
    clickedConnection.d_ptr = local_a0;
    local_a0 = (code *)CVar7.d_ptr;
    QMetaObject::Connection::~Connection((Connection *)&local_a0);
  }
  pQVar11 = view;
  local_a0 = QAbstractItemView::activated;
  local_98 = (ImplFn)0x0;
  local_80.iterator.i.d =
       (Data<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
        *)QAbstractItemView::activated;
  local_80.iterator.i.bucket = 0;
  puVar12 = (undefined4 *)operator_new(0x20);
  *puVar12 = 1;
  *(code **)(puVar12 + 2) =
       QtPrivate::
       QCallableObject<void_(QAbstractItemView::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar12 + 4) = QAbstractItemView::activated;
  *(undefined8 *)(puVar12 + 6) = 0;
  QObject::connectImpl
            ((QObject *)local_68,(void **)pQVar11,(QObject *)&local_80,(void **)parent,
             (QSlotObjectBase *)&local_a0,(ConnectionType)puVar12,(int *)0x0,(QMetaObject *)0x0);
  pQVar11 = view;
  local_b0 = QAbstractItemView::clicked;
  local_a8 = (ImplFn)0x0;
  local_80.iterator.i.d =
       (Data<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
        *)QAbstractItemView::clicked;
  local_80.iterator.i.bucket = 0;
  puVar12 = (undefined4 *)operator_new(0x20);
  *puVar12 = 1;
  *(code **)(puVar12 + 2) =
       QtPrivate::
       QCallableObject<void_(QAbstractItemView::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar12 + 4) = QAbstractItemView::clicked;
  *(undefined8 *)(puVar12 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_60,(void **)pQVar11,(QObject *)&local_80,(void **)parent,
             (QSlotObjectBase *)&local_b0,(ConnectionType)puVar12,(int *)0x0,(QMetaObject *)0x0);
  pQVar11 = view;
  local_c0 = QAbstractItemView::doubleClicked;
  local_b8 = (ImplFn)0x0;
  local_80.iterator.i.d =
       (Data<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
        *)QAbstractItemView::doubleClicked;
  local_80.iterator.i.bucket = 0;
  puVar12 = (undefined4 *)operator_new(0x20);
  *puVar12 = 1;
  *(code **)(puVar12 + 2) =
       QtPrivate::
       QCallableObject<void_(QAbstractItemView::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar12 + 4) = QAbstractItemView::doubleClicked;
  *(undefined8 *)(puVar12 + 6) = 0;
  QObject::connectImpl
            (local_58,(void **)pQVar11,(QObject *)&local_80,(void **)parent,
             (QSlotObjectBase *)&local_c0,(ConnectionType)puVar12,(int *)0x0,(QMetaObject *)0x0);
  pQVar11 = view;
  local_d0 = QAbstractItemView::entered;
  local_c8 = (ImplFn)0x0;
  local_80.iterator.i.d =
       (Data<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
        *)QAbstractItemView::entered;
  local_80.iterator.i.bucket = 0;
  puVar12 = (undefined4 *)operator_new(0x20);
  *puVar12 = 1;
  *(code **)(puVar12 + 2) =
       QtPrivate::
       QCallableObject<void_(QAbstractItemView::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar12 + 4) = QAbstractItemView::entered;
  *(undefined8 *)(puVar12 + 6) = 0;
  QObject::connectImpl
            (local_50,(void **)pQVar11,(QObject *)&local_80,(void **)parent,
             (QSlotObjectBase *)&local_d0,(ConnectionType)puVar12,(int *)0x0,(QMetaObject *)0x0);
  pQVar11 = view;
  local_e0 = QAbstractItemView::pressed;
  local_d8 = (ImplFn)0x0;
  local_80.iterator.i.d =
       (Data<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
        *)QAbstractItemView::pressed;
  local_80.iterator.i.bucket = 0;
  puVar12 = (undefined4 *)operator_new(0x20);
  *puVar12 = 1;
  *(code **)(puVar12 + 2) =
       QtPrivate::
       QCallableObject<void_(QAbstractItemView::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar12 + 4) = QAbstractItemView::pressed;
  *(undefined8 *)(puVar12 + 6) = 0;
  QObject::connectImpl
            (local_48,(void **)pQVar11,(QObject *)&local_80,(void **)parent,
             (QSlotObjectBase *)&local_e0,(ConnectionType)puVar12,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::Connection(&local_40,&clickedConnection);
  QHash<QAbstractItemView*,std::vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>>>
  ::tryEmplace_impl<QAbstractItemView*const&>
            (&local_80,
             (QHash<QAbstractItemView*,std::vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>>>
              *)&this->viewConnections,&view);
  std::vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>>::
  _M_assign_aux<QMetaObject::Connection_const*>
            ((vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>> *)
             ((local_80.iterator.i.d)->spans[local_80.iterator.i.bucket >> 7].entries
              [(local_80.iterator.i.d)->spans[local_80.iterator.i.bucket >> 7].offsets
               [(uint)local_80.iterator.i.bucket & 0x7f]].storage.data + 8),local_68,&local_38);
  lVar17 = 0x28;
  do {
    QMetaObject::Connection::~Connection((Connection *)(local_68 + lVar17));
    lVar17 = lVar17 + -8;
  } while (lVar17 != -8);
  QWidget::setFocusPolicy((QWidget *)view,NoFocus);
  QWidget::setParent((QWidget *)view,
                     (this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                     viewport);
  if (this->showResizeGrips == true) {
    pQVar15 = (QWidget *)operator_new(0x28);
    QColumnViewGrip::QColumnViewGrip((QColumnViewGrip *)pQVar15,(QWidget *)view);
    QAbstractScrollArea::setCornerWidget((QAbstractScrollArea *)view,pQVar15);
    local_68 = (undefined1  [8])QColumnViewGrip::gripMoved;
    local_60._0_4_ = 0;
    local_60._4_4_ = 0;
    local_80.iterator.i.d =
         (Data<QHashPrivate::Node<QAbstractItemView_*,_std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>_>_>
          *)gripMoved;
    local_80.iterator.i.bucket = 0;
    ppvVar4 = *(void ***)
               &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                super_QFramePrivate.super_QWidgetPrivate.field_0x8;
    puVar12 = (undefined4 *)operator_new(0x20);
    *puVar12 = 1;
    *(code **)(puVar12 + 2) =
         QtPrivate::
         QPrivateSlotObject<void_(QColumnViewPrivate::*)(int),_QtPrivate::List<int>,_void>::impl;
    *(code **)(puVar12 + 4) = gripMoved;
    *(undefined8 *)(puVar12 + 6) = 0;
    QObject::connectImpl
              ((QObject *)&local_a0,(void **)pQVar15,(QObject *)local_68,ppvVar4,
               (QSlotObjectBase *)&local_80,(ConnectionType)puVar12,(int *)0x0,(QMetaObject *)0x0);
    std::vector<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>::
    emplace_back<QMetaObject::Connection>(&this->gripConnections,(Connection *)&local_a0);
    QMetaObject::Connection::~Connection((Connection *)&local_a0);
  }
  uVar5 = (this->columns).d.size;
  if (uVar5 < (ulong)(this->columnSizes).d.size) {
    pQVar6 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    local_68 = (undefined1  [8])0x0;
    local_60._4_4_ = (pQVar6->crect).y2.m_i - (pQVar6->crect).y1.m_i;
    local_60._0_4_ = (this->columnSizes).d.ptr[uVar5] + -1;
    QWidget::setGeometry((QWidget *)view,(QRect *)local_68);
  }
  else {
    iVar9 = (**(code **)(*(long *)&(view->super_QAbstractScrollArea).super_QFrame.super_QWidget +
                        0x70))();
    LVar10 = QWidget::layoutDirection(parent);
    pQVar6 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    if (LVar10 == RightToLeft) {
      uVar1 = (pQVar6->crect).x1.m_i;
      iVar2 = (pQVar6->crect).x2.m_i;
      local_68._4_4_ = 0;
      local_68._0_4_ = (iVar2 - (uVar1 + iVar9)) + 1;
      local_60._4_4_ = (pQVar6->crect).y2.m_i - (pQVar6->crect).y1.m_i;
      local_60._0_4_ = ~uVar1 + iVar2 + 1;
    }
    else {
      local_68 = (undefined1  [8])0x0;
      local_60._4_4_ = (pQVar6->crect).y2.m_i - (pQVar6->crect).y1.m_i;
      local_60._0_4_ = iVar9 + -1;
    }
    QWidget::setGeometry((QWidget *)view,(QRect *)local_68);
    uVar5 = (this->columnSizes).d.size;
    size = (this->columns).d.size + 1;
    if (size < uVar5) {
      size = uVar5;
    }
    QList<int>::resize(&this->columnSizes,size);
    lVar17 = (this->columns).d.size;
    piVar16 = QList<int>::data(&this->columnSizes);
    piVar16[lVar17] = iVar9;
  }
  lVar17 = (this->columns).d.size;
  if (lVar17 != 0) {
    pQVar11 = (this->columns).d.ptr[lVar17 + -1];
    if ((((pQVar11->super_QAbstractScrollArea).super_QFrame.super_QWidget.data)->widget_attributes &
        0x10000) != 0) {
      (**(code **)(*(long *)&(pQVar11->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x68)
      )(pQVar11,1);
    }
  }
  local_68 = (undefined1  [8])view;
  QtPrivate::QPodArrayOps<QAbstractItemView*>::emplace<QAbstractItemView*&>
            ((QPodArrayOps<QAbstractItemView*> *)&this->columns,(this->columns).d.size,
             (QAbstractItemView **)local_68);
  QList<QAbstractItemView_*>::end(&this->columns);
  doLayout(this);
  updateScrollbars(this);
  if ((show) &&
     ((((view->super_QAbstractScrollArea).super_QFrame.super_QWidget.data)->widget_attributes &
      0x10000) != 0)) {
    (**(code **)(*(long *)&(view->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x68))
              (view,1);
  }
  pQVar11 = view;
  QMetaObject::Connection::~Connection(&clickedConnection);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar11;
  }
  __stack_chk_fail();
}

Assistant:

QAbstractItemView *QColumnViewPrivate::createColumn(const QModelIndex &index, bool show)
{
    Q_Q(QColumnView);
    QAbstractItemView *view = nullptr;
    QMetaObject::Connection clickedConnection;
    if (model->hasChildren(index)) {
        view = q->createColumn(index);
        clickedConnection = QObjectPrivate::connect(view, &QAbstractItemView::clicked,
                                                    this, &QColumnViewPrivate::clicked);
    } else {
        if (!previewColumn)
            setPreviewWidget(new QWidget(q));
        view = previewColumn;
        view->setMinimumWidth(qMax(view->minimumWidth(), previewWidget->minimumWidth()));
    }

    viewConnections[view] = {
        QObject::connect(view, &QAbstractItemView::activated, q, &QColumnView::activated),
        QObject::connect(view, &QAbstractItemView::clicked, q, &QColumnView::clicked),
        QObject::connect(view, &QAbstractItemView::doubleClicked, q, &QColumnView::doubleClicked),
        QObject::connect(view, &QAbstractItemView::entered, q, &QColumnView::entered),
        QObject::connect(view, &QAbstractItemView::pressed, q, &QColumnView::pressed),
        clickedConnection
    };

    view->setFocusPolicy(Qt::NoFocus);
    view->setParent(viewport);
    Q_ASSERT(view);

    // Setup corner grip
    if (showResizeGrips) {
        QColumnViewGrip *grip = new QColumnViewGrip(view);
        view->setCornerWidget(grip);
        gripConnections.push_back(
            QObjectPrivate::connect(grip, &QColumnViewGrip::gripMoved,
                                    this, &QColumnViewPrivate::gripMoved)
        );
    }

    if (columnSizes.size() > columns.size()) {
        view->setGeometry(0, 0, columnSizes.at(columns.size()), viewport->height());
    } else {
        int initialWidth = view->sizeHint().width();
        if (q->isRightToLeft())
            view->setGeometry(viewport->width() - initialWidth, 0, initialWidth, viewport->height());
        else
            view->setGeometry(0, 0, initialWidth, viewport->height());
        columnSizes.resize(qMax(columnSizes.size(), columns.size() + 1));
        columnSizes[columns.size()] = initialWidth;
    }
    if (!columns.isEmpty() && columns.constLast()->isHidden())
        columns.constLast()->setVisible(true);

    columns.append(view);
    doLayout();
    updateScrollbars();
    if (show && view->isHidden())
        view->setVisible(true);
    return view;
}